

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O3

int_fast64_t
absl::lts_20240722::time_internal::cctz::anon_unknown_0::TransOffset
          (bool leap_year,int jan1_weekday,PosixTransition *pt)

{
  char cVar1;
  DateFormat DVar2;
  short sVar3;
  anon_union_8_3_4e90bb4b_for_Date_1 aVar4;
  long lVar5;
  long lVar6;
  
  DVar2 = (pt->date).fmt;
  if (DVar2 == M) {
    lVar6 = (long)(pt->date).field_1.m.week;
    lVar5 = (long)*(short *)((anonymous_namespace)::kMonthOffsets +
                            ((ulong)(lVar6 == 5) + (long)(pt->date).field_1.m.month) * 2 +
                            (ulong)leap_year * 0x1c);
    sVar3 = (short)((jan1_weekday + lVar5) / 7) * -7 + (short)(jan1_weekday + lVar5);
    cVar1 = (pt->date).field_1.m.weekday;
    if (lVar6 == 5) {
      sVar3 = sVar3 - cVar1;
      aVar4 = (anon_union_8_3_4e90bb4b_for_Date_1)
              ((short)~(((short)(sVar3 + 6) / 7) * -7 + sVar3 + 6U) + lVar5);
    }
    else {
      sVar3 = cVar1 - sVar3;
      aVar4 = (anon_union_8_3_4e90bb4b_for_Date_1)
              ((long)(short)(sVar3 + ((short)(sVar3 + 7) / 7) * -7 + 7) + lVar6 * 7 + lVar5 + -7);
    }
  }
  else if (DVar2 == N) {
    aVar4 = (pt->date).field_1;
  }
  else if (DVar2 == J) {
    aVar4 = (pt->date).field_1;
    aVar4 = (anon_union_8_3_4e90bb4b_for_Date_1)
            ((long)aVar4 - (ulong)(!leap_year || (long)aVar4 < 0x3c));
  }
  else {
    aVar4 = (anon_union_8_3_4e90bb4b_for_Date_1)0x0;
  }
  return (long)aVar4 * 0x15180 + (pt->time).offset;
}

Assistant:

std::int_fast64_t TransOffset(bool leap_year, int jan1_weekday,
                              const PosixTransition& pt) {
  std::int_fast64_t days = 0;
  switch (pt.date.fmt) {
    case PosixTransition::J: {
      days = pt.date.j.day;
      if (!leap_year || days < kMonthOffsets[1][3]) days -= 1;
      break;
    }
    case PosixTransition::N: {
      days = pt.date.n.day;
      break;
    }
    case PosixTransition::M: {
      const bool last_week = (pt.date.m.week == 5);
      days = kMonthOffsets[leap_year][pt.date.m.month + last_week];
      const std::int_fast64_t weekday = (jan1_weekday + days) % 7;
      if (last_week) {
        days -= (weekday + 7 - 1 - pt.date.m.weekday) % 7 + 1;
      } else {
        days += (pt.date.m.weekday + 7 - weekday) % 7;
        days += (pt.date.m.week - 1) * 7;
      }
      break;
    }
  }
  return (days * kSecsPerDay) + pt.time.offset;
}